

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  void *pvVar1;
  string *psVar2;
  double dVar3;
  NonMaximumSuppression_PickTop *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  StringVector *from_00;
  Int64Vector *from_01;
  NonMaximumSuppression_PickTop *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_007074f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->confidenceinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->confidenceinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->confidenceinputfeaturename_,psVar2);
  }
  (this->coordinatesinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->coordinatesinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->coordinatesinputfeaturename_,psVar2);
  }
  (this->iouthresholdinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->iouthresholdinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->iouthresholdinputfeaturename_,psVar2);
  }
  (this->confidencethresholdinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->confidencethresholdinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->confidencethresholdinputfeaturename_,psVar2);
  }
  (this->confidenceoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->confidenceoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->confidenceoutputfeaturename_,psVar2);
  }
  (this->coordinatesoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->coordinatesoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->coordinatesoutputfeaturename_,psVar2);
  }
  dVar3 = from->confidencethreshold_;
  this->iouthreshold_ = from->iouthreshold_;
  this->confidencethreshold_ = dVar3;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    this->_oneof_case_[0] = 1;
    this_00 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
    NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_00);
    (this->SuppressionMethod_).picktop_ = this_00;
    if (from->_oneof_case_[0] == 1) {
      from_02 = (from->SuppressionMethod_).picktop_;
    }
    else {
      protobuf_NonMaximumSuppression_2eproto::InitDefaults();
      from_02 = (NonMaximumSuppression_PickTop *)&_NonMaximumSuppression_PickTop_default_instance_;
    }
    NonMaximumSuppression_PickTop::MergeFrom(this_00,from_02);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    this_02 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_02);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[1] == 0x65) {
      from_01 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_02,from_01);
  }
  else if (from->_oneof_case_[1] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 100;
    this_01 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_01);
    (this->ClassLabels_).stringclasslabels_ = this_01;
    if (from->_oneof_case_[1] == 100) {
      from_00 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression(const NonMaximumSuppression& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  confidenceinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidenceinputfeaturename().size() > 0) {
    confidenceinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceinputfeaturename_);
  }
  coordinatesinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.coordinatesinputfeaturename().size() > 0) {
    coordinatesinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesinputfeaturename_);
  }
  iouthresholdinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.iouthresholdinputfeaturename().size() > 0) {
    iouthresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iouthresholdinputfeaturename_);
  }
  confidencethresholdinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidencethresholdinputfeaturename().size() > 0) {
    confidencethresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidencethresholdinputfeaturename_);
  }
  confidenceoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidenceoutputfeaturename().size() > 0) {
    confidenceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceoutputfeaturename_);
  }
  coordinatesoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.coordinatesoutputfeaturename().size() > 0) {
    coordinatesoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesoutputfeaturename_);
  }
  ::memcpy(&iouthreshold_, &from.iouthreshold_,
    reinterpret_cast<char*>(&confidencethreshold_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(confidencethreshold_));
  clear_has_SuppressionMethod();
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from.picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppression)
}